

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

unsigned_long __thiscall
flatbuffers::Table::GetField<unsigned_long>(Table *this,voffset_t field,unsigned_long defaultval)

{
  voffset_t vVar1;
  unsigned_long local_38;
  voffset_t field_offset;
  unsigned_long defaultval_local;
  voffset_t field_local;
  Table *this_local;
  
  vVar1 = GetOptionalFieldOffset(this,field);
  local_38 = defaultval;
  if (vVar1 != 0) {
    local_38 = ReadScalar<unsigned_long>(this + (int)(uint)vVar1);
  }
  return local_38;
}

Assistant:

T GetField(voffset_t field, T defaultval) const {
    auto field_offset = GetOptionalFieldOffset(field);
    return field_offset ? ReadScalar<T>(data_ + field_offset) : defaultval;
  }